

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::FileDescriptorProto::ByteSizeLong(FileDescriptorProto *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  Edition value;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar4;
  const_reference pbVar5;
  size_t sVar6;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  reference value_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  reference value_01;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *this_02;
  reference value_02;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_03;
  reference value_03;
  RepeatedField<int> *pRVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  uint32_t *puVar12;
  string *psVar13;
  int local_10c;
  int n_1;
  int i_1;
  size_t tag_size_1;
  size_t data_size_1;
  size_t tag_size;
  size_t data_size;
  FieldDescriptorProto *msg_3;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *__range3_3;
  ServiceDescriptorProto *msg_2;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *__range3_2;
  EnumDescriptorProto *msg_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *__range3_1;
  DescriptorProto *msg;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::DescriptorProto> *__range3;
  int local_60;
  int n;
  int i;
  uint32_t cached_has_bits;
  size_t total_size;
  FileDescriptorProto *this_;
  FileDescriptorProto *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar4 = _internal_dependency_abi_cxx11_(this);
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar4);
  _i = internal::FromIntSize(iVar3);
  local_60 = 0;
  pRVar4 = _internal_dependency_abi_cxx11_(this);
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar4);
  for (; local_60 < iVar3; local_60 = local_60 + 1) {
    pRVar4 = _internal_dependency_abi_cxx11_(this);
    pbVar5 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Get(pRVar4,local_60);
    sVar6 = internal::WireFormatLite::StringSize(pbVar5);
    _i = sVar6 + _i;
  }
  iVar3 = _internal_message_type_size(this);
  _i = (long)iVar3 + _i;
  this_00 = _internal_message_type(this);
  __end3 = RepeatedPtrField<google::protobuf::DescriptorProto>::begin(this_00);
  msg = (DescriptorProto *)RepeatedPtrField<google::protobuf::DescriptorProto>::end(this_00);
  while (bVar2 = internal::operator!=(&__end3,(iterator *)&msg), bVar2) {
    value_00 = internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator*
                         (&__end3);
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::DescriptorProto>(value_00);
    _i = sVar6 + _i;
    internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator++(&__end3);
  }
  iVar3 = _internal_enum_type_size(this);
  _i = (long)iVar3 + _i;
  this_01 = _internal_enum_type(this);
  __end3_1 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::begin(this_01);
  msg_1 = (EnumDescriptorProto *)
          RepeatedPtrField<google::protobuf::EnumDescriptorProto>::end(this_01);
  while (bVar2 = internal::operator!=(&__end3_1,(iterator *)&msg_1), bVar2) {
    value_01 = internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::operator*
                         (&__end3_1);
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::EnumDescriptorProto>(value_01);
    _i = sVar6 + _i;
    internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::operator++
              (&__end3_1);
  }
  iVar3 = _internal_service_size(this);
  _i = (long)iVar3 + _i;
  this_02 = _internal_service(this);
  __end3_2 = RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::begin(this_02);
  msg_2 = (ServiceDescriptorProto *)
          RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::end(this_02);
  while (bVar2 = internal::operator!=(&__end3_2,(iterator *)&msg_2), bVar2) {
    value_02 = internal::RepeatedPtrIterator<const_google::protobuf::ServiceDescriptorProto>::
               operator*(&__end3_2);
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::ServiceDescriptorProto>
                      (value_02);
    _i = sVar6 + _i;
    internal::RepeatedPtrIterator<const_google::protobuf::ServiceDescriptorProto>::operator++
              (&__end3_2);
  }
  iVar3 = _internal_extension_size(this);
  _i = (long)iVar3 + _i;
  this_03 = _internal_extension(this);
  __end3_3 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::begin(this_03);
  msg_3 = (FieldDescriptorProto *)
          RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end(this_03);
  while (bVar2 = internal::operator!=(&__end3_3,(iterator *)&msg_3), bVar2) {
    value_03 = internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::
               operator*(&__end3_3);
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::FieldDescriptorProto>(value_03);
    _i = sVar6 + _i;
    internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::operator++
              (&__end3_3);
  }
  pRVar7 = _internal_public_dependency(this);
  sVar6 = internal::WireFormatLite::Int32Size(pRVar7);
  iVar3 = _internal_public_dependency_size(this);
  sVar8 = internal::FromIntSize(iVar3);
  pRVar7 = _internal_weak_dependency(this);
  sVar9 = internal::WireFormatLite::Int32Size(pRVar7);
  iVar3 = _internal_weak_dependency_size(this);
  sVar10 = internal::FromIntSize(iVar3);
  pRVar4 = _internal_option_dependency_abi_cxx11_(this);
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar4);
  sVar11 = internal::FromIntSize(iVar3);
  _i = sVar11 + sVar10 + sVar9 + sVar8 + sVar6 + _i;
  local_10c = 0;
  pRVar4 = _internal_option_dependency_abi_cxx11_(this);
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar4);
  for (; local_10c < iVar3; local_10c = local_10c + 1) {
    pRVar4 = _internal_option_dependency_abi_cxx11_(this);
    pbVar5 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Get(pRVar4,local_10c);
    sVar6 = internal::WireFormatLite::StringSize(pbVar5);
    _i = sVar6 + _i;
  }
  puVar12 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar12;
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar13 = _internal_name_abi_cxx11_(this);
      sVar6 = internal::WireFormatLite::StringSize(psVar13);
      _i = sVar6 + 1 + _i;
    }
    if ((uVar1 & 2) != 0) {
      psVar13 = _internal_package_abi_cxx11_(this);
      sVar6 = internal::WireFormatLite::StringSize(psVar13);
      _i = sVar6 + 1 + _i;
    }
    if ((uVar1 & 4) != 0) {
      psVar13 = _internal_syntax_abi_cxx11_(this);
      sVar6 = internal::WireFormatLite::StringSize(psVar13);
      _i = sVar6 + 1 + _i;
    }
    if ((uVar1 & 8) != 0) {
      sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::FileOptions>
                        ((this->field_0)._impl_.options_);
      _i = sVar6 + 1 + _i;
    }
    if ((uVar1 & 0x10) != 0) {
      sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::SourceCodeInfo>
                        ((this->field_0)._impl_.source_code_info_);
      _i = sVar6 + 1 + _i;
    }
    if ((uVar1 & 0x20) != 0) {
      value = _internal_edition(this);
      sVar6 = internal::WireFormatLite::EnumSize(value);
      _i = sVar6 + 1 + _i;
    }
  }
  sVar6 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,_i,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t FileDescriptorProto::ByteSizeLong() const {
  const FileDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileDescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated string dependency = 3;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_dependency().size());
      for (int i = 0, n = this_._internal_dependency().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_dependency().Get(i));
      }
    }
    // repeated .google.protobuf.DescriptorProto message_type = 4;
    {
      total_size += 1UL * this_._internal_message_type_size();
      for (const auto& msg : this_._internal_message_type()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
    {
      total_size += 1UL * this_._internal_enum_type_size();
      for (const auto& msg : this_._internal_enum_type()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.ServiceDescriptorProto service = 6;
    {
      total_size += 1UL * this_._internal_service_size();
      for (const auto& msg : this_._internal_service()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.FieldDescriptorProto extension = 7;
    {
      total_size += 1UL * this_._internal_extension_size();
      for (const auto& msg : this_._internal_extension()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated int32 public_dependency = 10;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_public_dependency());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_public_dependency_size());
      total_size += tag_size + data_size;
    }
    // repeated int32 weak_dependency = 11;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_weak_dependency());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_weak_dependency_size());
      total_size += tag_size + data_size;
    }
    // repeated string option_dependency = 15;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_option_dependency().size());
      for (int i = 0, n = this_._internal_option_dependency().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_option_dependency().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional string package = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_package());
    }
    // optional string syntax = 12;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_syntax());
    }
    // optional .google.protobuf.FileOptions options = 8;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
    // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.source_code_info_);
    }
    // optional .google.protobuf.Edition edition = 14;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_edition());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}